

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

char * __thiscall
cmBoundsCheckerParser::GetAttribute(cmBoundsCheckerParser *this,char *name,char **atts)

{
  int iVar1;
  
  do {
    if (*atts == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = strcmp(name,*atts);
    atts = atts + 1;
  } while (iVar1 != 0);
  return *atts;
}

Assistant:

const char* GetAttribute(const char* name, const char** atts)
  {
    int i = 0;
    for (; atts[i] != nullptr; ++i) {
      if (strcmp(name, atts[i]) == 0) {
        return atts[i + 1];
      }
    }
    return nullptr;
  }